

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkLevel(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  float fVar5;
  int local_54;
  Abc_Obj_t *pDriver;
  int LevelsMax;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  if ((pNtk->pManTime == (Abc_ManTime_t *)0x0) || (pNtk->AndGateDelay <= 0.0)) {
    for (pDriver._4_4_ = 0; iVar3 = Abc_NtkCiNum(pNtk), pDriver._4_4_ < iVar3;
        pDriver._4_4_ = pDriver._4_4_ + 1) {
      _LevelsMax = Abc_NtkCi(pNtk,pDriver._4_4_);
      *(uint *)&_LevelsMax->field_0x14 = *(uint *)&_LevelsMax->field_0x14 & 0xfff;
    }
  }
  else {
    for (pDriver._4_4_ = 0; iVar3 = Abc_NtkCiNum(pNtk), pDriver._4_4_ < iVar3;
        pDriver._4_4_ = pDriver._4_4_ + 1) {
      _LevelsMax = Abc_NtkCi(pNtk,pDriver._4_4_);
      fVar5 = Abc_NodeReadArrivalWorst(_LevelsMax);
      fVar5 = Abc_MaxFloat(0.0,fVar5);
      *(uint *)&_LevelsMax->field_0x14 =
           *(uint *)&_LevelsMax->field_0x14 & 0xfff | (int)(fVar5 / pNtk->AndGateDelay) << 0xc;
    }
  }
  pDriver._0_4_ = 0;
  Abc_NtkIncrementTravId(pNtk);
  if (pNtk->nBarBufs == 0) {
    for (pDriver._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), pDriver._4_4_ < iVar3;
        pDriver._4_4_ = pDriver._4_4_ + 1) {
      pAVar4 = Abc_NtkObj(pNtk,pDriver._4_4_);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) &&
         (Abc_NtkLevel_rec(pAVar4), (uint)pDriver < *(uint *)&pAVar4->field_0x14 >> 0xc)) {
        pDriver._0_4_ = *(uint *)&pAVar4->field_0x14 >> 0xc;
      }
    }
  }
  else {
    pDriver._4_4_ = 0;
    while( true ) {
      iVar3 = Abc_NtkCoNum(pNtk);
      bVar2 = false;
      if (pDriver._4_4_ < iVar3) {
        if (pDriver._4_4_ < pNtk->nBarBufs) {
          local_54 = Abc_NtkCoNum(pNtk);
          local_54 = local_54 - pNtk->nBarBufs;
        }
        else {
          local_54 = -pNtk->nBarBufs;
        }
        local_54 = local_54 + pDriver._4_4_;
        _LevelsMax = Abc_NtkCo(pNtk,local_54);
        bVar2 = true;
      }
      if (!bVar2) break;
      pAVar4 = Abc_ObjFanin0(_LevelsMax);
      Abc_NtkLevel_rec(pAVar4);
      if ((uint)pDriver < *(uint *)&pAVar4->field_0x14 >> 0xc) {
        pDriver._0_4_ = *(uint *)&pAVar4->field_0x14 >> 0xc;
      }
      if (pDriver._4_4_ < pNtk->nBarBufs) {
        uVar1 = *(uint *)&pAVar4->field_0x14;
        pAVar4 = Abc_ObjFanout0(_LevelsMax);
        pAVar4 = Abc_ObjFanout0(pAVar4);
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xfff | uVar1 & 0xfffff000;
      }
      pDriver._4_4_ = pDriver._4_4_ + 1;
    }
  }
  return (uint)pDriver;
}

Assistant:

int Abc_NtkLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CI levels
    if ( pNtk->pManTime == NULL || pNtk->AndGateDelay <= 0 )
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = 0;
    else
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pNode)) / pNtk->AndGateDelay);
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_NtkLevel_rec( pNode );
            if ( LevelsMax < (int)pNode->Level )
                LevelsMax = (int)pNode->Level;
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Abc_Obj_t * pDriver = Abc_ObjFanin0(pNode);
            Abc_NtkLevel_rec( pDriver );
            if ( LevelsMax < (int)pDriver->Level )
                LevelsMax = (int)pDriver->Level;
            // transfer the delay
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = pDriver->Level;
        }
    }
    return LevelsMax;
}